

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_NodeAssignRandom(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Ivy_FraigSim_t *pIVar3;
  int local_24;
  int i;
  Ivy_FraigSim_t *pSims;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  iVar1 = Ivy_ObjIsPi(pObj);
  if (iVar1 != 0) {
    pIVar3 = Ivy_ObjSim(pObj);
    for (local_24 = 0; local_24 < p->nSimWords; local_24 = local_24 + 1) {
      uVar2 = Ivy_ObjRandomSim();
      (&pIVar3[1].Type)[local_24] = uVar2;
    }
    return;
  }
  __assert_fail("Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0x2ac,"void Ivy_NodeAssignRandom(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_NodeAssignRandom( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{
    Ivy_FraigSim_t * pSims;
    int i;
    assert( Ivy_ObjIsPi(pObj) );
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        pSims->pData[i] = Ivy_ObjRandomSim();
}